

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftzopen.c
# Opt level: O0

int ft_lzwstate_prefix_grow(FT_LzwState state)

{
  FT_UShort *pFVar1;
  int local_2c;
  FT_Memory pFStack_28;
  FT_Error error;
  FT_Memory memory;
  FT_UInt new_size;
  FT_UInt old_size;
  FT_LzwState state_local;
  
  memory._4_4_ = state->prefix_size;
  pFStack_28 = state->memory;
  if (memory._4_4_ == 0) {
    memory._0_4_ = 0x200;
  }
  else {
    memory._0_4_ = (memory._4_4_ >> 2) + memory._4_4_;
  }
  _new_size = state;
  pFVar1 = (FT_UShort *)
           ft_mem_realloc(pFStack_28,3,(ulong)memory._4_4_,(ulong)(uint)memory,state->prefix,
                          &local_2c);
  _new_size->prefix = pFVar1;
  if (local_2c == 0) {
    _new_size->suffix = (FT_Byte *)(_new_size->prefix + (uint)memory);
    memmove(_new_size->suffix,_new_size->prefix + memory._4_4_,(ulong)memory._4_4_);
    _new_size->prefix_size = (uint)memory;
    state_local._4_4_ = 0;
  }
  else {
    state_local._4_4_ = -1;
  }
  return state_local._4_4_;
}

Assistant:

static int
  ft_lzwstate_prefix_grow( FT_LzwState  state )
  {
    FT_UInt    old_size = state->prefix_size;
    FT_UInt    new_size = old_size;
    FT_Memory  memory   = state->memory;
    FT_Error   error;


    if ( new_size == 0 )  /* first allocation -> 9 bits */
      new_size = 512;
    else
      new_size += new_size >> 2;  /* don't grow too fast */

    /*
     *  Note that the `suffix' array is located in the same memory block
     *  pointed to by `prefix'.
     *
     *  I know that sizeof(FT_Byte) == 1 by definition, but it is clearer
     *  to write it literally.
     *
     */
    if ( FT_REALLOC_MULT( state->prefix, old_size, new_size,
                          sizeof ( FT_UShort ) + sizeof ( FT_Byte ) ) )
      return -1;

    /* now adjust `suffix' and move the data accordingly */
    state->suffix = (FT_Byte*)( state->prefix + new_size );

    FT_MEM_MOVE( state->suffix,
                 state->prefix + old_size,
                 old_size * sizeof ( FT_Byte ) );

    state->prefix_size = new_size;
    return 0;
  }